

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

PHYSFS_uint32 utf8codepoint(char **_str)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  PHYSFS_uint32 octet4;
  PHYSFS_uint32 octet3;
  PHYSFS_uint32 octet2;
  PHYSFS_uint32 octet;
  PHYSFS_uint32 retval;
  char *str;
  char **_str_local;
  
  pbVar4 = (byte *)*_str;
  _str_local._4_4_ = (uint)*pbVar4;
  if (_str_local._4_4_ == 0) {
    _str_local._4_4_ = 0;
  }
  else if (_str_local._4_4_ < 0x80) {
    *_str = *_str + 1;
  }
  else if ((_str_local._4_4_ < 0x80) || (0xbf < _str_local._4_4_)) {
    if (_str_local._4_4_ < 0xe0) {
      *_str = *_str + 1;
      bVar1 = pbVar4[1];
      if ((bVar1 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      *_str = *_str + 1;
      uVar5 = (_str_local._4_4_ - 0xc0) * 0x40 | bVar1 - 0x80;
      if ((0x7f < uVar5) && (uVar5 < 0x800)) {
        return uVar5;
      }
    }
    else if (_str_local._4_4_ < 0xf0) {
      *_str = *_str + 1;
      bVar1 = pbVar4[1];
      if ((bVar1 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      bVar2 = pbVar4[2];
      if ((bVar2 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      *_str = *_str + 2;
      uVar5 = (_str_local._4_4_ - 0xe0) * 0x1000 | (uint)bVar1 * 0x40 - 0x2000 | bVar2 - 0x80;
      if ((((uVar5 == 0xd800) || (uVar5 - 0xdb7f < 2)) || (uVar5 - 0xdbff < 2)) ||
         ((uVar5 == 0xdf80 || (uVar5 == 0xdfff)))) {
        return 0xffffffff;
      }
      if ((0x7ff < uVar5) && (uVar5 < 0xfffe)) {
        return uVar5;
      }
    }
    else {
      if (0xf7 < _str_local._4_4_) {
        if (0xfb < _str_local._4_4_) {
          *_str = *_str + 1;
          if ((pbVar4[1] & 0xc0) != 0x80) {
            return 0xffffffff;
          }
          if ((pbVar4[2] & 0xc0) != 0x80) {
            return 0xffffffff;
          }
          if ((pbVar4[3] & 0xc0) != 0x80) {
            return 0xffffffff;
          }
          if ((pbVar4[4] & 0xc0) != 0x80) {
            return 0xffffffff;
          }
          if ((pbVar4[5] & 0xc0) != 0x80) {
            return 0xffffffff;
          }
          *_str = *_str + 6;
          return 0xffffffff;
        }
        *_str = *_str + 1;
        if ((pbVar4[1] & 0xc0) != 0x80) {
          return 0xffffffff;
        }
        if ((pbVar4[2] & 0xc0) != 0x80) {
          return 0xffffffff;
        }
        if ((pbVar4[3] & 0xc0) != 0x80) {
          return 0xffffffff;
        }
        if ((pbVar4[4] & 0xc0) != 0x80) {
          return 0xffffffff;
        }
        *_str = *_str + 4;
        return 0xffffffff;
      }
      *_str = *_str + 1;
      bVar1 = pbVar4[1];
      if ((bVar1 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      bVar2 = pbVar4[2];
      if ((bVar2 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      bVar3 = pbVar4[3];
      if ((bVar3 & 0xc0) != 0x80) {
        return 0xffffffff;
      }
      *_str = *_str + 3;
      uVar5 = (_str_local._4_4_ - 0xf0) * 0x40000 | (bVar1 - 0x80) * 0x1000 | (bVar2 - 0x80) * 0x40
              | bVar3 - 0x80;
      if ((0xffff < uVar5) && (uVar5 < 0x110000)) {
        return uVar5;
      }
    }
    _str_local._4_4_ = 0xffffffff;
  }
  else {
    *_str = *_str + 1;
    _str_local._4_4_ = 0xffffffff;
  }
  return _str_local._4_4_;
}

Assistant:

static PHYSFS_uint32 utf8codepoint(const char **_str)
{
    const char *str = *_str;
    PHYSFS_uint32 retval = 0;
    PHYSFS_uint32 octet = (PHYSFS_uint32) ((PHYSFS_uint8) *str);
    PHYSFS_uint32 octet2, octet3, octet4;

    if (octet == 0)  /* null terminator, end of string. */
        return 0;

    else if (octet < 128)  /* one octet char: 0 to 127 */
    {
        (*_str)++;  /* skip to next possible start of codepoint. */
        return octet;
    } /* else if */

    else if ((octet > 127) && (octet < 192))  /* bad (starts with 10xxxxxx). */
    {
        /*
         * Apparently each of these is supposed to be flagged as a bogus
         *  char, instead of just resyncing to the next valid codepoint.
         */
        (*_str)++;  /* skip to next possible start of codepoint. */
        return UNICODE_BOGUS_CHAR_VALUE;
    } /* else if */

    else if (octet < 224)  /* two octets */
    {
        (*_str)++;  /* advance at least one byte in case of an error */
        octet -= (128+64);
        octet2 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet2 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        *_str += 1;  /* skip to next possible start of codepoint. */
        retval = ((octet << 6) | (octet2 - 128));
        if ((retval >= 0x80) && (retval <= 0x7FF))
            return retval;
    } /* else if */

    else if (octet < 240)  /* three octets */
    {
        (*_str)++;  /* advance at least one byte in case of an error */
        octet -= (128+64+32);
        octet2 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet2 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet3 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet3 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        *_str += 2;  /* skip to next possible start of codepoint. */
        retval = ( ((octet << 12)) | ((octet2-128) << 6) | ((octet3-128)) );

        /* There are seven "UTF-16 surrogates" that are illegal in UTF-8. */
        switch (retval)
        {
            case 0xD800:
            case 0xDB7F:
            case 0xDB80:
            case 0xDBFF:
            case 0xDC00:
            case 0xDF80:
            case 0xDFFF:
                return UNICODE_BOGUS_CHAR_VALUE;
        } /* switch */

        /* 0xFFFE and 0xFFFF are illegal, too, so we check them at the edge. */
        if ((retval >= 0x800) && (retval <= 0xFFFD))
            return retval;
    } /* else if */

    else if (octet < 248)  /* four octets */
    {
        (*_str)++;  /* advance at least one byte in case of an error */
        octet -= (128+64+32+16);
        octet2 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet2 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet3 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet3 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet4 = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet4 & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        *_str += 3;  /* skip to next possible start of codepoint. */
        retval = ( ((octet << 18)) | ((octet2 - 128) << 12) |
                   ((octet3 - 128) << 6) | ((octet4 - 128)) );
        if ((retval >= 0x10000) && (retval <= 0x10FFFF))
            return retval;
    } /* else if */

    /*
     * Five and six octet sequences became illegal in rfc3629.
     *  We throw the codepoint away, but parse them to make sure we move
     *  ahead the right number of bytes and don't overflow the buffer.
     */

    else if (octet < 252)  /* five octets */
    {
        (*_str)++;  /* advance at least one byte in case of an error */
        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        *_str += 4;  /* skip to next possible start of codepoint. */
        return UNICODE_BOGUS_CHAR_VALUE;
    } /* else if */

    else  /* six octets */
    {
        (*_str)++;  /* advance at least one byte in case of an error */
        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        octet = (PHYSFS_uint32) ((PHYSFS_uint8) *(++str));
        if ((octet & (128+64)) != 128)  /* Format isn't 10xxxxxx? */
            return UNICODE_BOGUS_CHAR_VALUE;

        *_str += 6;  /* skip to next possible start of codepoint. */
        return UNICODE_BOGUS_CHAR_VALUE;
    } /* else if */

    return UNICODE_BOGUS_CHAR_VALUE;
}